

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# break_on_failure_nobreak_tests.cpp
# Opt level: O0

void __thiscall iu_Foo_x_iutest_x_Skip_Test::Body(iu_Foo_x_iutest_x_Skip_Test *this)

{
  bool bVar1;
  char *message;
  AssertionHelper local_1c8;
  Fixed local_198;
  iu_Foo_x_iutest_x_Skip_Test *local_10;
  iu_Foo_x_iutest_x_Skip_Test *this_local;
  
  local_10 = this;
  iutest::detail::AlwaysZero();
  bVar1 = iutest::detail::AlwaysTrue();
  if (bVar1) {
    memset(&local_198,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_198);
    bVar1 = iutest::UnitTestImpl::SkipTest();
    message = "Skipped. but already failed. ";
    if (bVar1) {
      message = "Skipped. ";
    }
    iutest::AssertionHelper::AssertionHelper
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/break_on_failure_nobreak_tests.cpp"
               ,0x16,message,kSkip);
    iutest::AssertionHelper::operator=(&local_1c8,&local_198);
    iutest::AssertionHelper::~AssertionHelper(&local_1c8);
    iutest::AssertionHelper::Fixed::~Fixed(&local_198);
  }
  return;
}

Assistant:

IUTEST(Foo, Skip)
{
    IUTEST_SKIP();
}